

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.h
# Opt level: O2

string_view __thiscall slang::ast::InstanceArraySymbol::getArrayName(InstanceArraySymbol *this)

{
  Scope *pSVar1;
  InstanceArraySymbol *this_00;
  string_view sVar2;
  
  pSVar1 = (this->super_Symbol).parentScope;
  if ((pSVar1 != (Scope *)0x0) &&
     (this_00 = (InstanceArraySymbol *)pSVar1->thisSym,
     (this_00->super_Symbol).kind == InstanceArray)) {
    sVar2 = getArrayName(this_00);
    return sVar2;
  }
  return (this->super_Symbol).name;
}

Assistant:

const Scope* getParentScope() const { return parentScope; }